

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  CumulativeReporterBase<Catch::JunitReporter> *in_RDI;
  
  (in_RDI->super_IStreamingReporter)._vptr_IStreamingReporter =
       (_func_int **)&PTR__JunitReporter_004d2c38;
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1].m_testGroups.
              super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::JunitReporter>::SectionNode>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&in_RDI[1].m_testCases);
  XmlWriter::~XmlWriter((XmlWriter *)in_RDI);
  CumulativeReporterBase<Catch::JunitReporter>::~CumulativeReporterBase(in_RDI);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}